

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestBranchInternal2::TestBranchInternal2(TestBranchInternal2 *this,string *name)

{
  string local_38 [32];
  string *local_18;
  string *name_local;
  TestBranchInternal2 *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_38);
  testinator::Test::Test(&this->super_Test,name,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestBranchInternal2_002c2ea0;
  return;
}

Assistant:

TestBranchInternal2(const string& name)
    : testinator::Test(name)
  {}